

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_keyval_create_
               (MPIABI_Fint *comm_copy_attr_fn,MPIABI_Fint *comm_delete_attr_fn,int *comm_keyval,
               void *extra_state,MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  void *extra_state_local;
  int *comm_keyval_local;
  MPIABI_Fint *comm_delete_attr_fn_local;
  MPIABI_Fint *comm_copy_attr_fn_local;
  
  mpi_keyval_create_(comm_copy_attr_fn,comm_delete_attr_fn,comm_keyval,extra_state,ierror);
  return;
}

Assistant:

void mpiabi_keyval_create_(
  MPIABI_Fint * comm_copy_attr_fn,
  MPIABI_Fint * comm_delete_attr_fn,
  int * comm_keyval,
  void * extra_state,
  MPIABI_Fint * ierror
) {
  return mpi_keyval_create_(
    comm_copy_attr_fn,
    comm_delete_attr_fn,
    comm_keyval,
    extra_state,
    ierror
  );
}